

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocation.cpp
# Opt level: O0

void __thiscall
mocker::detail::RegisterAllocator::color(RegisterAllocator *this,RegMap<Node> *coloring)

{
  Section *this_00;
  bool bVar1;
  __type _Var2;
  pointer pLVar3;
  reference __args;
  element_type *peVar4;
  string *__lhs;
  string *__rhs;
  LineIter LVar5;
  Line local_128;
  LineIter local_f8;
  reference local_f0;
  Line *inst_1;
  iterator __end2;
  iterator __begin2;
  list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_> *__range2;
  undefined1 local_b0 [16];
  undefined1 local_a0 [8];
  shared_ptr<mocker::nasm::Register> src;
  undefined1 local_80 [8];
  shared_ptr<mocker::nasm::Register> dest;
  shared_ptr<mocker::nasm::Mov> p;
  shared_ptr<mocker::nasm::Inst> newInst;
  shared_ptr<mocker::nasm::Inst> *inst;
  LineIter iter;
  list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_> insts;
  RegMap<Node> *coloring_local;
  RegisterAllocator *this_local;
  
  std::__cxx11::list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>::list
            ((list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_> *)&iter);
  inst = (shared_ptr<mocker::nasm::Inst> *)(this->funcBeg)._M_node;
  do {
    bVar1 = std::operator!=((_Self *)&inst,&this->funcEnd);
    if (!bVar1) {
      LVar5 = nasm::Section::erase(this->section,(this->funcBeg)._M_node,(this->funcEnd)._M_node);
      (this->funcEnd)._M_node = LVar5._M_node;
      (this->funcBeg)._M_node = (this->funcEnd)._M_node;
      std::_List_const_iterator<mocker::nasm::Line>::operator--(&this->funcBeg);
      __end2 = std::__cxx11::list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>::begin
                         ((list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_> *)&iter);
      inst_1 = (Line *)std::__cxx11::list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>::
                       end((list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_> *)&iter);
      while (bVar1 = std::operator!=(&__end2,(_Self *)&inst_1), bVar1) {
        local_f0 = std::_List_iterator<mocker::nasm::Line>::operator*(&__end2);
        this_00 = this->section;
        local_f8._M_node = (this->funcEnd)._M_node;
        nasm::Line::Line(&local_128,local_f0);
        nasm::Section::appendLine(this_00,local_f8,&local_128);
        nasm::Line::~Line(&local_128);
        std::_List_iterator<mocker::nasm::Line>::operator++(&__end2);
      }
      std::_List_const_iterator<mocker::nasm::Line>::operator++(&this->funcBeg);
      std::__cxx11::list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>::~list
                ((list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_> *)&iter);
      return;
    }
    pLVar3 = std::_List_const_iterator<mocker::nasm::Line>::operator->
                       ((_List_const_iterator<mocker::nasm::Line> *)&inst);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&pLVar3->inst);
    if (bVar1) {
      nasm::replaceRegs((nasm *)&p.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount,&pLVar3->inst,coloring);
      nasm::dyc<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Inst>&>
                ((shared_ptr<mocker::nasm::Inst> *)
                 &dest.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      bVar1 = std::__shared_ptr::operator_cast_to_bool
                        ((__shared_ptr *)
                         &dest.
                          super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
      if (bVar1) {
        std::__shared_ptr_access<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&dest.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
        nasm::Mov::getDest((Mov *)&src.
                                   super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount);
        nasm::dyc<mocker::nasm::Register,std::shared_ptr<mocker::nasm::Addr>const>
                  ((shared_ptr<mocker::nasm::Addr> *)local_80);
        std::shared_ptr<mocker::nasm::Addr>::~shared_ptr
                  ((shared_ptr<mocker::nasm::Addr> *)
                   &src.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_ptr_access<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&dest.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
        nasm::Mov::getOperand((Mov *)local_b0);
        nasm::dyc<mocker::nasm::Register,std::shared_ptr<mocker::nasm::Addr>const>
                  ((shared_ptr<mocker::nasm::Addr> *)local_a0);
        std::shared_ptr<mocker::nasm::Addr>::~shared_ptr((shared_ptr<mocker::nasm::Addr> *)local_b0)
        ;
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_80);
        if ((bVar1) &&
           (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_a0), bVar1)) {
          peVar4 = std::
                   __shared_ptr_access<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_80);
          __lhs = nasm::Register::getIdentifier_abi_cxx11_(peVar4);
          peVar4 = std::
                   __shared_ptr_access<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_a0);
          __rhs = nasm::Register::getIdentifier_abi_cxx11_(peVar4);
          _Var2 = std::operator==(__lhs,__rhs);
          if (!_Var2) goto LAB_00181876;
          pLVar3 = std::_List_const_iterator<mocker::nasm::Line>::operator->
                             ((_List_const_iterator<mocker::nasm::Line> *)&inst);
          std::__cxx11::list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>>::
          emplace_back<std::__cxx11::string_const&>
                    ((list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>> *)&iter,
                     &pLVar3->label);
          bVar1 = true;
        }
        else {
LAB_00181876:
          bVar1 = false;
        }
        std::shared_ptr<mocker::nasm::Register>::~shared_ptr
                  ((shared_ptr<mocker::nasm::Register> *)local_a0);
        std::shared_ptr<mocker::nasm::Register>::~shared_ptr
                  ((shared_ptr<mocker::nasm::Register> *)local_80);
        if (!bVar1) goto LAB_001818ae;
      }
      else {
LAB_001818ae:
        bVar1 = false;
      }
      std::shared_ptr<mocker::nasm::Mov>::~shared_ptr
                ((shared_ptr<mocker::nasm::Mov> *)
                 &dest.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      if (!bVar1) {
        pLVar3 = std::_List_const_iterator<mocker::nasm::Line>::operator->
                           ((_List_const_iterator<mocker::nasm::Line> *)&inst);
        std::__cxx11::list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>>::
        emplace_back<std::__cxx11::string_const&,std::shared_ptr<mocker::nasm::Inst>&>
                  ((list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>> *)&iter,
                   &pLVar3->label,
                   (shared_ptr<mocker::nasm::Inst> *)
                   &p.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        ;
      }
      std::shared_ptr<mocker::nasm::Inst>::~shared_ptr
                ((shared_ptr<mocker::nasm::Inst> *)
                 &p.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    else {
      __args = std::_List_const_iterator<mocker::nasm::Line>::operator*
                         ((_List_const_iterator<mocker::nasm::Line> *)&inst);
      std::__cxx11::list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>>::
      emplace_back<mocker::nasm::Line_const&>
                ((list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>> *)&iter,__args);
    }
    std::_List_const_iterator<mocker::nasm::Line>::operator++
              ((_List_const_iterator<mocker::nasm::Line> *)&inst);
  } while( true );
}

Assistant:

void RegisterAllocator::color(const RegMap<Node> &coloring) {
  std::list<nasm::Line> insts;
  for (auto iter = funcBeg; iter != funcEnd; ++iter) {
    auto &inst = iter->inst;
    if (!inst) {
      insts.emplace_back(*iter);
      continue;
    }
    auto newInst = nasm::replaceRegs(inst, coloring);
    if (auto p = nasm::dyc<nasm::Mov>(newInst)) {
      auto dest = nasm::dyc<nasm::Register>(p->getDest());
      auto src = nasm::dyc<nasm::Register>(p->getOperand());
      if (dest && src && dest->getIdentifier() == src->getIdentifier()) {
        insts.emplace_back(iter->label);
        continue;
      }
    }
    insts.emplace_back(iter->label, newInst);
  }

  funcBeg = funcEnd = section.erase(funcBeg, funcEnd);
  --funcBeg;
  for (auto &inst : insts) {
    section.appendLine(funcEnd, std::move(inst));
  }
  ++funcBeg;
}